

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall
ON_OBSOLETE_V5_Leader::GetArrowHeadDirection(ON_OBSOLETE_V5_Leader *this,ON_2dVector *arrowhead_dir)

{
  ON_2dPoint *this_00;
  bool bVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  ON_2dVector OVar4;
  
  uVar3 = (ulong)(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
                 m_count;
  if ((long)uVar3 < 2) {
    ON_2dVector::Set(arrowhead_dir,-1.0,0.0);
    bVar1 = false;
  }
  else {
    uVar2 = 1;
    do {
      this_00 = (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
                m_a;
      OVar4 = ON_2dPoint::operator-(this_00,this_00 + uVar2);
      *arrowhead_dir = OVar4;
      bVar1 = ON_2dVector::Unitize(arrowhead_dir);
      if (bVar1) {
        return true;
      }
      ON_2dVector::Set(arrowhead_dir,-1.0,0.0);
      uVar2 = uVar2 + 1;
      bVar1 = uVar2 < uVar3;
    } while (uVar2 != uVar3);
  }
  return bVar1;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::GetArrowHeadDirection( ON_2dVector& arrowhead_dir ) const
{
  bool rc = false;
  const int point_count = m_points.Count();
  if ( point_count < 2 )
  {
    arrowhead_dir.Set(-1.0,0.0);
  }
  else
  {
    int i;
    for ( i = 1; i < point_count; i++ )
    {
      arrowhead_dir = m_points[0] -  m_points[i];
      if ( arrowhead_dir.Unitize() )
      {
        rc = true;
        break;
      }
      arrowhead_dir.Set(-1.0,0.0);
    }
  }
  return rc;
}